

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

qpdf_offset_t __thiscall
QPDF::processXRefStream(QPDF *this,qpdf_offset_t xref_offset,QPDFObjectHandle *xref_obj)

{
  byte bVar1;
  undefined8 f1;
  bool bVar2;
  uint max_num_entries;
  int iVar3;
  int f0;
  int f2;
  size_t j;
  size_t __val;
  unsigned_long uVar4;
  unsigned_long uVar5;
  byte *pbVar6;
  pointer ppVar7;
  long lVar8;
  longlong lVar9;
  QPDFExc *pQVar10;
  int iVar11;
  char *pcVar12;
  pair<int,_int> pVar13;
  QPDFObjectHandle *pQVar14;
  _Any_data *this_00;
  ulong uVar15;
  int iVar16;
  bool bVar17;
  string_view msg;
  QPDFObjectHandle dict;
  undefined1 local_238 [32];
  pair<int,_std::array<int,_3UL>_> local_218;
  anon_class_16_2_099dce64 damaged;
  shared_ptr<Buffer> bp;
  QPDFExc x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_e8;
  string local_d8;
  string local_b8;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  pQVar14 = &dict;
  damaged.this = this;
  damaged.xref_offset = xref_offset;
  QPDFObjectHandle::getDict(&dict);
  local_58._M_unused._M_object = damaged.this;
  local_58._8_8_ = damaged.xref_offset;
  local_40 = std::
             _Function_handler<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDF_objects.cc:910:20)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDF_objects.cc:910:20)>
             ::_M_manager;
  local_218 = processXRefW((QPDF *)pQVar14,&dict,
                           (function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>
                            *)&local_58);
  this_00 = &local_58;
  std::_Function_base::~_Function_base((_Function_base *)this_00);
  local_78._M_unused._M_object = damaged.this;
  local_78._8_8_ = damaged.xref_offset;
  local_60 = std::
             _Function_handler<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDF_objects.cc:910:20)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDF_objects.cc:910:20)>
             ::_M_manager;
  pQVar14 = &dict;
  max_num_entries =
       processXRefSize((QPDF *)this_00,pQVar14,local_218.first,
                       (function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)> *)
                       &local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  local_98._M_unused._M_object = damaged.this;
  local_98._8_8_ = damaged.xref_offset;
  local_80 = std::
             _Function_handler<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDF_objects.cc:910:20)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDF_objects.cc:910:20)>
             ::_M_manager;
  pcVar12 = (char *)(ulong)max_num_entries;
  processXRefIndex(&local_128,(QPDF *)pQVar14,&dict,max_num_entries,
                   (function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)> *)
                   &local_98);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  QPDFObjectHandle::getStreamData((QPDFObjectHandle *)&bp,(qpdf_stream_decode_level_e)xref_obj);
  __val = Buffer::getSize(bp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  uVar4 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&local_218.first);
  uVar5 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&local_128.first);
  uVar15 = uVar5 * uVar4;
  if (uVar15 - __val != 0) {
    std::__cxx11::to_string(&local_b8,uVar15);
    std::operator+(&local_108,"Cross-reference stream data has the wrong size; expected = ",
                   &local_b8);
    std::operator+(&local_148,&local_108,"; actual = ");
    std::__cxx11::to_string(&local_d8,__val);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                   &local_148,&local_d8);
    msg._M_str = pcVar12;
    msg._M_len = local_238._0_8_;
    processXRefStream::anon_class_16_2_099dce64::operator()(&x,&damaged,msg);
    std::__cxx11::string::~string((string *)local_238);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_b8);
    if (__val <= uVar15 && uVar15 - __val != 0) {
      pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
      QPDFExc::QPDFExc(pQVar10,&x);
      __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    warn(this,&x);
    QPDFExc::~QPDFExc(&x);
  }
  pbVar6 = Buffer::getBuffer(bp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  bVar2 = false;
  ppVar7 = local_128.second.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (ppVar7 == local_128.second.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      if (*(long *)&(((this->m)._M_t.
                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
                      .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                      super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->trailer).
                    super_BaseHandle == 0) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_e8,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&dict);
        setTrailer(this,(QPDFObjectHandle *)&local_e8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&x,"/Prev",(allocator<char> *)local_238);
      bVar2 = QPDFObjectHandle::hasKey(&dict,(string *)&x);
      std::__cxx11::string::~string((string *)&x);
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&x,"/Prev",(allocator<char> *)&local_148);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_238,(string *)&dict);
        bVar2 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_238);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_238 + 8));
        std::__cxx11::string::~string((string *)&x);
        if (!bVar2) {
          pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&x,"xref stream",(allocator<char> *)&local_148);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_238,"/Prev key in xref stream dictionary is not an integer",
                     (allocator<char> *)&local_108);
          damagedPDF(pQVar10,this,(string *)&x,(string *)local_238);
          __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&x,"/Prev",(allocator<char> *)&local_148);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_238,(string *)&dict);
        lVar9 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)local_238);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_238 + 8));
        std::__cxx11::string::~string((string *)&x);
      }
      else {
        lVar9 = 0;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&bp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                (&local_128.second.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&dict.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return lVar9;
    }
    pVar13 = *ppVar7;
    iVar16 = 0;
    iVar3 = pVar13.second;
    if (pVar13.second == 0 || (long)pVar13 < 0) {
      iVar3 = 0;
    }
    for (; iVar16 != iVar3; iVar16 = iVar16 + 1) {
      x.error_code = qpdf_e_success;
      x._20_4_ = 0;
      x.super_runtime_error = (runtime_error)0x0;
      x._1_7_ = 0;
      x._8_8_ = 0;
      if (local_218.second._M_elems[0] == 0) {
        x.super_runtime_error = (runtime_error)0x1;
        x._1_7_ = 0;
      }
      x._1_7_ = 0;
      x.super_runtime_error = (runtime_error)(local_218.second._M_elems[0] == 0);
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        iVar11 = local_218.second._M_elems[lVar8];
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        while (bVar17 = iVar11 != 0, iVar11 = iVar11 + -1, bVar17) {
          uVar15 = *(long *)(&x.super_runtime_error + lVar8 * 8) << 8;
          *(ulong *)(&x.super_runtime_error + lVar8 * 8) = uVar15;
          bVar1 = *pbVar6;
          pbVar6 = pbVar6 + 1;
          *(ulong *)(&x.super_runtime_error + lVar8 * 8) = bVar1 | uVar15;
        }
      }
      iVar11 = pVar13.first;
      bVar17 = x._0_8_ == 2;
      if (bVar2) {
        if (x._0_8_ != 2) {
          ((this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
          uncompressed_after_compressed = true;
          bVar17 = true;
          goto LAB_001e2ee3;
        }
        bVar2 = true;
        if (iVar11 == 0) goto LAB_001e2f27;
LAB_001e2eec:
        f0 = QIntC::IntConverter<long_long,_int,_true,_true>::convert((longlong *)&x);
        f1 = x._8_8_;
        f2 = QIntC::IntConverter<long_long,_int,_true,_true>::convert((longlong *)&x.error_code);
        insertXrefEntry(this,iVar11,f0,f1,f2);
      }
      else {
LAB_001e2ee3:
        bVar2 = bVar17;
        if (iVar11 == 0) {
LAB_001e2f27:
          ((this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->first_xref_item_offset =
               xref_offset;
        }
        else {
          if (x._0_8_ != 0) goto LAB_001e2eec;
          insertFreeXrefEntry(this,(QPDFObjGen)((ulong)pVar13 & 0xffffffff));
        }
      }
      pVar13.first = iVar11 + 1;
      pVar13.second = 0;
    }
    ppVar7 = ppVar7 + 1;
  } while( true );
}

Assistant:

qpdf_offset_t
QPDF::processXRefStream(qpdf_offset_t xref_offset, QPDFObjectHandle& xref_obj)
{
    auto damaged = [this, xref_offset](std::string_view msg) -> QPDFExc {
        return damagedPDF("xref stream", xref_offset, msg.data());
    };

    auto dict = xref_obj.getDict();

    auto [entry_size, W] = processXRefW(dict, damaged);
    int max_num_entries = processXRefSize(dict, entry_size, damaged);
    auto [num_entries, indx] = processXRefIndex(dict, max_num_entries, damaged);

    std::shared_ptr<Buffer> bp = xref_obj.getStreamData(qpdf_dl_specialized);
    size_t actual_size = bp->getSize();
    auto expected_size = toS(entry_size) * toS(num_entries);

    if (expected_size != actual_size) {
        QPDFExc x = damaged(
            "Cross-reference stream data has the wrong size; expected = " +
            std::to_string(expected_size) + "; actual = " + std::to_string(actual_size));
        if (expected_size > actual_size) {
            throw x;
        } else {
            warn(x);
        }
    }

    bool saw_first_compressed_object = false;

    // Actual size vs. expected size check above ensures that we will not overflow any buffers here.
    // We know that entry_size * num_entries is less or equal to the size of the buffer.
    auto p = bp->getBuffer();
    for (auto [obj, sec_entries]: indx) {
        // Process a subsection.
        for (int i = 0; i < sec_entries; ++i) {
            // Read this entry
            std::array<qpdf_offset_t, 3> fields{};
            if (W[0] == 0) {
                QTC::TC("qpdf", "QPDF default for xref stream field 0");
                fields[0] = 1;
            }
            for (size_t j = 0; j < 3; ++j) {
                for (int k = 0; k < W[j]; ++k) {
                    fields[j] <<= 8;
                    fields[j] |= *p++;
                }
            }

            // Get the generation number.  The generation number is 0 unless this is an uncompressed
            // object record, in which case the generation number appears as the third field.
            if (saw_first_compressed_object) {
                if (fields[0] != 2) {
                    m->uncompressed_after_compressed = true;
                }
            } else if (fields[0] == 2) {
                saw_first_compressed_object = true;
            }
            if (obj == 0) {
                // This is needed by checkLinearization()
                m->first_xref_item_offset = xref_offset;
            } else if (fields[0] == 0) {
                // Ignore fields[2], which we don't care about in this case. This works around the
                // issue of some PDF files that put invalid values, like -1, here for deleted
                // objects.
                insertFreeXrefEntry(QPDFObjGen(obj, 0));
            } else {
                insertXrefEntry(obj, toI(fields[0]), fields[1], toI(fields[2]));
            }
            ++obj;
        }
    }

    if (!m->trailer) {
        setTrailer(dict);
    }

    if (dict.hasKey("/Prev")) {
        if (!dict.getKey("/Prev").isInteger()) {
            throw damagedPDF(
                "xref stream", "/Prev key in xref stream dictionary is not an integer");
        }
        QTC::TC("qpdf", "QPDF prev key in xref stream dictionary");
        return dict.getKey("/Prev").getIntValue();
    } else {
        return 0;
    }
}